

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::SSARewriter::ApplyReplacements(SSARewriter *this)

{
  pointer ppPVar1;
  PhiCandidate *phi_candidate;
  pointer puVar2;
  pair<unsigned_int,_unsigned_int> repl;
  pointer ppIVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  pointer ppPVar7;
  DefUseManager *pDVar8;
  Instruction *pIVar9;
  CFG *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  Instruction *this_01;
  DecorationManager *this_02;
  DebugInfoManager *this_03;
  pointer ppIVar13;
  __node_base *p_Var14;
  bool bVar15;
  pointer puVar16;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint local_13c;
  iterator insert_it;
  iterator local_f8;
  SmallVector<unsigned_int,_2UL> SStack_f0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> phi_operands;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> generated_phis
  ;
  SmallVector<unsigned_int,_2UL> local_90;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  already_seen;
  
  generated_phis.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  generated_phis.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  generated_phis.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppPVar7 = (this->phis_to_generate_).
            super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar1 = (this->phis_to_generate_).
            super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar15 = false;
  while( true ) {
    ppIVar3 = generated_phis.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppIVar13 = generated_phis.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppPVar7 == ppPVar1) {
      for (; ppIVar13 != ppIVar3; ppIVar13 = ppIVar13 + 1) {
        pIVar9 = *ppIVar13;
        pDVar8 = Pass::get_def_use_mgr(&this->pass_->super_Pass);
        analysis::DefUseManager::AnalyzeInstUse(pDVar8,pIVar9);
      }
      p_Var14 = &(this->load_replacement_)._M_h._M_before_begin;
      while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
        repl = *(pair<unsigned_int,_unsigned_int> *)(p_Var14 + 1);
        uVar4 = GetReplacement(this,repl);
        pDVar8 = IRContext::get_def_use_mgr((this->pass_->super_Pass).context_);
        uVar5 = repl.first;
        pIVar9 = analysis::DefUseManager::GetDef(pDVar8,uVar5);
        IRContext::KillNamesAndDecorates((this->pass_->super_Pass).context_,uVar5);
        IRContext::ReplaceAllUsesWith((this->pass_->super_Pass).context_,uVar5,uVar4);
        IRContext::KillInst((this->pass_->super_Pass).context_,pIVar9);
        bVar15 = true;
      }
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&generated_phis.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
      return bVar15;
    }
    phi_candidate = *ppPVar7;
    if (phi_candidate->is_complete_ == false) break;
    pDVar8 = Pass::get_def_use_mgr(&this->pass_->super_Pass);
    pIVar9 = analysis::DefUseManager::GetDef(pDVar8,phi_candidate->var_id_);
    uVar4 = Pass::GetPointeeTypeId(&this->pass_->super_Pass,pIVar9);
    phi_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    phi_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    phi_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    already_seen._M_h._M_buckets = &already_seen._M_h._M_single_bucket;
    already_seen._M_h._M_bucket_count = 1;
    already_seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    already_seen._M_h._M_element_count = 0;
    already_seen._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    already_seen._M_h._M_rehash_policy._M_next_resize = 0;
    already_seen._M_h._M_single_bucket = (__node_base_ptr)0x0;
    this_00 = Pass::cfg(&this->pass_->super_Pass);
    uVar5 = BasicBlock::id(phi_candidate->bb_);
    pvVar10 = CFG::preds(this_00,uVar5);
    puVar16 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar2 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = 0;
    while( true ) {
      if (puVar16 == puVar2) break;
      insert_it.super_iterator.node_._0_4_ = *puVar16;
      uVar6 = GetPhiArgument(this,phi_candidate,uVar5);
      sVar11 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(&already_seen._M_h,(key_type *)&insert_it);
      if (sVar11 == 0) {
        init_list._M_len = 1;
        init_list._M_array = &local_13c;
        local_13c = uVar6;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list);
        local_f8.node_._0_4_ = SPV_OPERAND_TYPE_ID;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_f0,&local_90);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&phi_operands,(Operand *)&local_f8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&SStack_f0);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
        local_13c = (uint)insert_it.super_iterator.node_;
        init_list_00._M_len = 1;
        init_list_00._M_array = &local_13c;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list_00);
        local_f8.node_._0_4_ = SPV_OPERAND_TYPE_ID;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_f0,&local_90);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&phi_operands,(Operand *)&local_f8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&SStack_f0);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
        pmVar12 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&already_seen,(key_type *)&insert_it);
        *pmVar12 = uVar6;
      }
      else {
        pmVar12 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&already_seen._M_h,(key_type *)&insert_it);
        if (*pmVar12 != uVar6) {
          __assert_fail("already_seen[pred_label] == op_val_id && \"Inconsistent value for duplicate edges.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                        ,0x21b,"bool spvtools::opt::SSARewriter::ApplyReplacements()");
        }
      }
      puVar16 = puVar16 + 1;
      uVar5 = uVar5 + 1;
    }
    this_01 = (Instruction *)::operator_new(0x70);
    Instruction::Instruction
              (this_01,(this->pass_->super_Pass).context_,OpPhi,uVar4,phi_candidate->result_id_,
               &phi_operands);
    local_f8.node_ = this_01;
    local_90._vptr_SmallVector = (_func_int **)this_01;
    std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
    emplace_back<spvtools::opt::Instruction*>
              ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
               &generated_phis,(Instruction **)&local_f8);
    pDVar8 = Pass::get_def_use_mgr(&this->pass_->super_Pass);
    analysis::DefUseManager::AnalyzeInstDef(pDVar8,(Instruction *)local_90._vptr_SmallVector);
    IRContext::set_instr_block
              ((this->pass_->super_Pass).context_,(Instruction *)local_90._vptr_SmallVector,
               phi_candidate->bb_);
    insert_it.super_iterator.node_ =
         (iterator)
         (phi_candidate->bb_->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
         super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    InstructionList::iterator::InsertBefore
              ((iterator *)&local_f8,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&insert_it);
    insert_it.super_iterator.node_ = (iterator)(iterator)local_f8.node_;
    this_02 = IRContext::get_decoration_mgr((this->pass_->super_Pass).context_);
    uVar4 = phi_candidate->var_id_;
    uVar5 = phi_candidate->result_id_;
    local_13c = 0;
    local_f8.node_ = (Instruction *)0x0;
    SStack_f0._vptr_SmallVector = (_func_int **)0x0;
    SStack_f0.size_ = 0;
    std::vector<spv::Decoration,std::allocator<spv::Decoration>>::
    _M_range_initialize<spv::Decoration_const*>
              ((vector<spv::Decoration,std::allocator<spv::Decoration>> *)&local_f8,&local_13c,
               &insert_it);
    analysis::DecorationManager::CloneDecorations
              (this_02,uVar4,uVar5,
               (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)&local_f8);
    std::_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>::~_Vector_base
              ((_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_> *)&local_f8);
    Instruction::SetDebugScope((Instruction *)insert_it.super_iterator.node_,&pIVar9->dbg_scope_);
    this_03 = IRContext::get_debug_info_mgr((this->pass_->super_Pass).context_);
    analysis::DebugInfoManager::AddDebugValueForVariable
              (this_03,(Instruction *)insert_it.super_iterator.node_,phi_candidate->var_id_,
               phi_candidate->result_id_,(Instruction *)insert_it.super_iterator.node_);
    if ((Instruction *)local_90._vptr_SmallVector != (Instruction *)0x0) {
      (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_90._vptr_SmallVector)->
        _vptr_IntrusiveNodeBase[1])();
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&already_seen._M_h);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              (&phi_operands);
    ppPVar7 = ppPVar7 + 1;
    bVar15 = true;
  }
  __assert_fail("phi_candidate->is_complete() && \"Tried to instantiate a Phi instruction from an incomplete Phi \" \"candidate\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                ,0x205,"bool spvtools::opt::SSARewriter::ApplyReplacements()");
}

Assistant:

void SSARewriter::ReplacePhiUsersWith(const PhiCandidate& phi_to_remove,
                                      uint32_t repl_id) {
  for (uint32_t user_id : phi_to_remove.users()) {
    PhiCandidate* user_phi = GetPhiCandidate(user_id);
    BasicBlock* bb = pass_->context()->get_instr_block(user_id);
    if (user_phi) {
      // If the user is a Phi candidate, replace all arguments that refer to
      // |phi_to_remove.result_id()| with |repl_id|.
      for (uint32_t& arg : user_phi->phi_args()) {
        if (arg == phi_to_remove.result_id()) {
          arg = repl_id;
        }
      }
    } else if (bb->id() == user_id) {
      // The phi candidate is the definition of the variable at basic block
      // |bb|.  We must change this to the replacement.
      WriteVariable(phi_to_remove.var_id(), bb, repl_id);
    } else {
      // For regular loads, traverse the |load_replacement_| table looking for
      // instances of |phi_to_remove|.
      for (auto& it : load_replacement_) {
        if (it.second == phi_to_remove.result_id()) {
          it.second = repl_id;
        }
      }
    }
  }
}